

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_state.hpp
# Opt level: O2

void __thiscall duckdb::AggregateFinalizeData::ReturnNull(AggregateFinalizeData *this)

{
  Vector *vector;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  vector = this->result;
  if (vector->vector_type == CONSTANT_VECTOR) {
    ConstantVector::SetNull(vector,true);
    return;
  }
  if (vector->vector_type == FLAT_VECTOR) {
    FlatVector::SetNull(vector,this->result_idx,true);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Invalid result vector type for aggregate",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void ReturnNull() {
		switch (result.GetVectorType()) {
		case VectorType::FLAT_VECTOR:
			FlatVector::SetNull(result, result_idx, true);
			break;
		case VectorType::CONSTANT_VECTOR:
			ConstantVector::SetNull(result, true);
			break;
		default:
			throw InternalException("Invalid result vector type for aggregate");
		}
	}